

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O3

QpVector * __thiscall QpVector::operator-(QpVector *__return_storage_ptr__,QpVector *this)

{
  pointer piVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  int iVar6;
  
  QpVector(__return_storage_ptr__,this->dim);
  iVar6 = this->num_nz;
  if (0 < iVar6) {
    piVar1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (__return_storage_ptr__->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (__return_storage_ptr__->value).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      iVar6 = piVar1[lVar5];
      piVar3[lVar5] = iVar6;
      pdVar4[iVar6] = -pdVar2[iVar6];
      lVar5 = lVar5 + 1;
      iVar6 = this->num_nz;
    } while (lVar5 < iVar6);
  }
  __return_storage_ptr__->num_nz = iVar6;
  return __return_storage_ptr__;
}

Assistant:

QpVector operator-() const {
    QpVector result(dim);

    for (HighsInt i = 0; i < num_nz; i++) {
      result.index[i] = index[i];
      result.value[index[i]] = -value[index[i]];
    }
    result.num_nz = num_nz;

    return result;
  }